

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86_avx512::forward_int8
          (Gemm_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *B;
  float fVar1;
  float fVar2;
  int iVar3;
  pointer pMVar4;
  Mat *pMVar5;
  void *pvVar6;
  void *pvVar7;
  int max_kk;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  float max_kk_00;
  int iVar29;
  int *piVar30;
  ulong uVar31;
  int iVar32;
  float fVar33;
  size_t sVar34;
  bool bVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  uint local_354;
  float B_int8_scale;
  int TILE_K;
  ulong local_338;
  ulong local_328;
  ulong local_320;
  Mat m_3;
  Mat m_1;
  Mat local_268;
  int TILE_K_2;
  Mat m;
  Mat local_1c8;
  Mat local_178;
  Mat m_2;
  float B_int8_scale_1;
  Mat *local_d0;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  ulong local_80;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  iVar29 = (this->super_Gemm).constantA;
  iVar26 = (this->super_Gemm).constantB;
  if (iVar26 != 0 && iVar29 != 0) {
    uVar13 = (this->super_Gemm).constantM;
LAB_004a160c:
    uVar27 = (this->super_Gemm).constantN;
  }
  else {
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar29 == 0) {
      iVar3 = (this->super_Gemm).transA;
      if (iVar26 != 0) {
        if (iVar3 == 0) {
          uVar13 = pMVar4->elempack * (&pMVar4->h)[(ulong)(pMVar4->dims == 3) * 2];
        }
        else {
          uVar13 = pMVar4->w;
        }
        goto LAB_004a160c;
      }
      if (iVar3 == 0) {
        uVar13 = pMVar4->elempack * (&pMVar4->h)[(ulong)(pMVar4->dims == 3) * 2];
      }
      else {
        uVar13 = pMVar4->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar27 = pMVar4[1].w;
      }
      else {
        uVar27 = pMVar4[1].elempack * (&pMVar4[1].h)[(ulong)(pMVar4[1].dims == 3) * 2];
      }
    }
    else {
      uVar13 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar27 = pMVar4->w;
      }
      else {
        uVar27 = pMVar4->elempack * (&pMVar4->h)[(ulong)(pMVar4->dims == 3) * 2];
      }
    }
  }
  uVar36 = 0;
  uVar37 = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar4;
    if (iVar26 != 0 && iVar29 != 0) {
      bVar35 = true;
      if (lVar24 == 0x48) {
        local_268.data = pMVar4->data;
        piVar30 = pMVar4->refcount;
        sVar34 = pMVar4->elemsize;
        local_268.elempack = pMVar4->elempack;
        local_268.allocator = pMVar4->allocator;
        uVar36._0_4_ = pMVar4->dims;
        uVar36._4_4_ = pMVar4->w;
        uVar37._0_4_ = pMVar4->h;
        uVar37._4_4_ = pMVar4->d;
        local_268.c = pMVar4->c;
        local_268.cstep = pMVar4->cstep;
        if (piVar30 == (int *)0x0) {
          piVar30 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          bVar35 = false;
        }
      }
      else {
        local_268.allocator = (Allocator *)0x0;
        local_268.elempack = 0;
        sVar34 = 0;
        piVar30 = (int *)0x0;
        local_268.data = (void *)0x0;
        local_268.c = 0;
        local_268.cstep = 0;
      }
      local_268.refcount._0_4_ = SUB84(piVar30,0);
      local_268.refcount._4_4_ = (undefined4)((ulong)piVar30 >> 0x20);
      local_268.elemsize._0_4_ = (undefined4)sVar34;
      local_268.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
      local_268.dims = (int)uVar36;
      local_268.w = (int)((ulong)uVar36 >> 0x20);
      local_268.h = (int)uVar37;
      local_268.d = (int)((ulong)uVar37 >> 0x20);
      if (!bVar35) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_268.allocator == (Allocator *)0x0) goto LAB_004a4392;
          (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
        }
      }
    }
    else if (iVar29 == 0) {
      if (iVar26 == 0) {
        bVar35 = true;
        if (lVar24 == 0xd8) {
          local_268.data = pMVar4[2].data;
          piVar30 = pMVar4[2].refcount;
          sVar34 = pMVar4[2].elemsize;
          local_268.elempack = pMVar4[2].elempack;
          local_268.allocator = pMVar4[2].allocator;
          uVar36._0_4_ = pMVar4[2].dims;
          uVar36._4_4_ = pMVar4[2].w;
          uVar37._0_4_ = pMVar4[2].h;
          uVar37._4_4_ = pMVar4[2].d;
          local_268.c = pMVar4[2].c;
          local_268.cstep = pMVar4[2].cstep;
          if (piVar30 == (int *)0x0) {
            piVar30 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            bVar35 = false;
          }
        }
        else {
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.allocator = (Allocator *)0x0;
          local_268.elempack = 0;
          sVar34 = 0;
          piVar30 = (int *)0x0;
          local_268.data = (void *)0x0;
        }
        local_268.refcount._0_4_ = SUB84(piVar30,0);
        local_268.refcount._4_4_ = (undefined4)((ulong)piVar30 >> 0x20);
        local_268.elemsize._0_4_ = (undefined4)sVar34;
        local_268.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
        local_268.dims = (int)uVar36;
        local_268.w = (int)((ulong)uVar36 >> 0x20);
        local_268.h = (int)uVar37;
        local_268.d = (int)((ulong)uVar37 >> 0x20);
        if (!bVar35) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_268.allocator == (Allocator *)0x0) goto LAB_004a4392;
            (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
          }
        }
      }
      else {
        bVar35 = true;
        if (lVar24 == 0x90) {
          local_268.data = pMVar4[1].data;
          piVar30 = pMVar4[1].refcount;
          sVar34 = pMVar4[1].elemsize;
          local_268.elempack = pMVar4[1].elempack;
          local_268.allocator = pMVar4[1].allocator;
          uVar36._0_4_ = pMVar4[1].dims;
          uVar36._4_4_ = pMVar4[1].w;
          uVar37._0_4_ = pMVar4[1].h;
          uVar37._4_4_ = pMVar4[1].d;
          local_268.c = pMVar4[1].c;
          local_268.cstep = pMVar4[1].cstep;
          if (piVar30 == (int *)0x0) {
            piVar30 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            bVar35 = false;
          }
        }
        else {
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.allocator = (Allocator *)0x0;
          local_268.elempack = 0;
          sVar34 = 0;
          piVar30 = (int *)0x0;
          local_268.data = (void *)0x0;
        }
        local_268.refcount._0_4_ = SUB84(piVar30,0);
        local_268.refcount._4_4_ = (undefined4)((ulong)piVar30 >> 0x20);
        local_268.elemsize._0_4_ = (undefined4)sVar34;
        local_268.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
        local_268.dims = (int)uVar36;
        local_268.w = (int)((ulong)uVar36 >> 0x20);
        local_268.h = (int)uVar37;
        local_268.d = (int)((ulong)uVar37 >> 0x20);
        if (!bVar35) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_268.allocator == (Allocator *)0x0) {
LAB_004a4392:
              if (local_268.data != (void *)0x0) {
                free(local_268.data);
              }
            }
            else {
              (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
            }
          }
        }
      }
    }
    else {
      bVar35 = true;
      if (lVar24 == 0x90) {
        local_268.data = pMVar4[1].data;
        piVar30 = pMVar4[1].refcount;
        sVar34 = pMVar4[1].elemsize;
        local_268.elempack = pMVar4[1].elempack;
        local_268.allocator = pMVar4[1].allocator;
        uVar36._0_4_ = pMVar4[1].dims;
        uVar36._4_4_ = pMVar4[1].w;
        uVar37._0_4_ = pMVar4[1].h;
        uVar37._4_4_ = pMVar4[1].d;
        local_268.c = pMVar4[1].c;
        local_268.cstep = pMVar4[1].cstep;
        if (piVar30 == (int *)0x0) {
          piVar30 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          bVar35 = false;
        }
      }
      else {
        local_268.cstep = 0;
        local_268.c = 0;
        local_268.allocator = (Allocator *)0x0;
        local_268.elempack = 0;
        sVar34 = 0;
        piVar30 = (int *)0x0;
        local_268.data = (void *)0x0;
      }
      local_268.refcount._0_4_ = SUB84(piVar30,0);
      local_268.refcount._4_4_ = (undefined4)((ulong)piVar30 >> 0x20);
      local_268.elemsize._0_4_ = (undefined4)sVar34;
      local_268.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
      local_268.dims = (int)uVar36;
      local_268.w = (int)((ulong)uVar36 >> 0x20);
      local_268.h = (int)uVar37;
      local_268.d = (int)((ulong)uVar37 >> 0x20);
      if (!bVar35) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_268.allocator == (Allocator *)0x0) goto LAB_004a4392;
          (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
        }
      }
    }
    local_354 = 0;
    if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
      if (local_268.dims == 1) {
        local_354 = 4;
        if (local_268.w * local_268.elempack != uVar27) {
          local_354 = (uint)(local_268.w * local_268.elempack == uVar13);
        }
      }
      else {
        bVar35 = local_268.dims == 2;
        local_354 = 0;
        if (local_268.w == 1U && bVar35) {
          local_354 = (uint)(local_268.elempack * local_268.h == uVar13) * 2;
        }
        if ((local_268.w == 1U && bVar35 || bVar35) && (local_268.w == uVar27)) {
          if (local_268.elempack * local_268.h == uVar13) {
            local_354 = 3;
          }
          if (local_268.elempack * local_268.h == 1) {
            local_354 = 4;
          }
        }
      }
    }
  }
  else {
    piVar30 = (this->CT_data).refcount;
    if (piVar30 != (int *)0x0) {
      LOCK();
      *piVar30 = *piVar30 + 1;
      UNLOCK();
    }
    local_268.data = (this->CT_data).data;
    piVar30 = (this->CT_data).refcount;
    local_268.refcount._0_4_ = SUB84(piVar30,0);
    local_268.refcount._4_4_ = (undefined4)((ulong)piVar30 >> 0x20);
    sVar34 = (this->CT_data).elemsize;
    local_268.elemsize._0_4_ = (undefined4)sVar34;
    local_268.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
    local_268.elempack = (this->CT_data).elempack;
    local_268.allocator = (this->CT_data).allocator;
    uVar8 = (this->CT_data).dims;
    uVar9 = (this->CT_data).w;
    uVar10 = (this->CT_data).h;
    uVar11 = (this->CT_data).d;
    local_268.c = (this->CT_data).c;
    local_268.cstep = (this->CT_data).cstep;
    local_354 = (this->super_Gemm).constant_broadcast_type_C;
    local_268.dims = uVar8;
    local_268.w = uVar9;
    local_268.h = uVar10;
    local_268.d = uVar11;
  }
  iVar29 = (this->super_Gemm).output_transpose;
  iVar26 = 1;
  if (opt->use_packing_layout == true) {
    uVar22 = uVar27;
    if (iVar29 == 0) {
      uVar22 = uVar13;
    }
    if ((uVar22 & 0xf) == 0) {
      iVar26 = 0x10;
    }
    else if ((uVar22 & 7) == 0) {
      iVar26 = 8;
    }
    else {
      iVar26 = (uint)((uVar22 & 3) == 0) * 3 + 1;
    }
  }
  iVar3 = (this->super_Gemm).output_elempack;
  if (iVar3 != 0) {
    iVar26 = iVar3;
  }
  pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar22 = uVar27;
  if (iVar29 != 0) {
    uVar22 = uVar13;
    uVar13 = uVar27;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(pMVar5,uVar22,(int)uVar13 / iVar26,(ulong)(uint)(iVar26 * 4),iVar26,
                opt->blob_allocator);
  }
  else {
    Mat::create(pMVar5,uVar22,1,(int)uVar13 / iVar26,(ulong)(uint)(iVar26 * 4),iVar26,
                opt->blob_allocator);
  }
  iVar29 = -100;
  if ((pMVar5->data == (void *)0x0) || ((long)pMVar5->c * pMVar5->cstep == 0)) goto LAB_004a465f;
  iVar29 = *(int *)&(this->super_Gemm).field_0x244;
  iVar26 = iVar29;
  if (iVar29 == 0) {
    iVar26 = opt->num_threads;
  }
  if (opt->num_threads != iVar29 && iVar29 != 0) {
    forward_int8();
  }
  iVar29 = (this->super_Gemm).constantA;
  iVar3 = (this->super_Gemm).constantB;
  local_d0 = pMVar5;
  if (iVar3 == 0 || iVar29 == 0) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar29 == 0) {
      if (iVar3 == 0) {
        iVar3 = (this->super_Gemm).transA;
        iVar15 = (this->super_Gemm).transB;
        if (iVar3 == 0) {
          iVar28 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
          iVar23 = pMVar5->w;
        }
        else {
          iVar28 = pMVar5->w;
          iVar23 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
        }
        if (iVar15 == 0) {
          uVar13 = pMVar5[1].w;
        }
        else {
          uVar13 = pMVar5[1].elempack * (&pMVar5[1].h)[(ulong)(pMVar5[1].dims == 3) * 2];
        }
        iVar32 = (this->super_Gemm).output_transpose;
        fVar1 = (this->super_Gemm).alpha;
        fVar2 = (this->super_Gemm).beta;
        get_optimal_tile_mnk_int8
                  (iVar28,uVar13,iVar23,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_K,
                   (int *)&B_int8_scale,&TILE_K_2,iVar26);
        iVar16 = TILE_K_2;
        iVar20 = TILE_K;
        fVar17 = B_int8_scale;
        local_328 = CONCAT44(local_328._4_4_,(iVar28 + TILE_K + -1) / TILE_K);
        iVar25 = (int)(uVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale;
        iVar21 = (TILE_K_2 + iVar23 + -1) / TILE_K_2;
        local_1c8.cstep = 0;
        local_1c8.data = (Mat *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        local_320 = (ulong)uVar13;
        if (TILE_K_2 < 4) {
LAB_004a2ff3:
          Mat::create(&local_1c8,iVar16 * iVar20,iVar21,iVar26,1,opt->workspace_allocator);
        }
        else {
          iVar29 = cpu_support_x86_avx512_vnni();
          bVar35 = true;
          if (iVar29 == 0) {
            iVar29 = cpu_support_x86_avx_vnni();
            bVar35 = iVar29 != 0;
          }
          iVar29 = cpu_support_x86_avx_vnni_int8();
          if (!(bool)(bVar35 & iVar29 == 0)) goto LAB_004a2ff3;
          iVar29 = 0x40;
          if (((iVar20 < 0x10) && (iVar29 = 0x20, iVar20 < 8)) && (iVar29 = 0x10, iVar20 < 4)) {
            iVar29 = (uint)(1 < iVar20) * 4 + 4;
          }
          Mat::create(&local_1c8,(iVar29 + iVar16) * iVar20,iVar21,iVar26,1,opt->workspace_allocator
                     );
        }
        iVar29 = -100;
        if (((Mat *)local_1c8.data != (Mat *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
          local_178.cstep = 0;
          local_178.data = (Mat *)0x0;
          local_178.refcount._0_4_ = 0;
          local_178.refcount._4_4_ = 0;
          local_178.elemsize._0_4_ = 0;
          local_178.elemsize._4_4_ = 0;
          local_178.elempack = 0;
          local_178.allocator = (Allocator *)0x0;
          local_178.dims = 0;
          local_178.w = 0;
          local_178.h = 0;
          local_178.d = 0;
          local_178.c = 0;
          Mat::create(&local_178,iVar16 * (int)fVar17,iVar21,iVar25,1,opt->workspace_allocator);
          iVar29 = -100;
          if (((Mat *)local_178.data != (Mat *)0x0) && ((long)local_178.c * local_178.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            Mat::create(&m_3,iVar28,4,opt->workspace_allocator);
            iVar29 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              B = pMVar5 + 1;
              compute_B_int8_scale(B,&B_int8_scale_1);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,iVar28,4,opt->workspace_allocator);
              iVar29 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                iVar25 = iVar21 * iVar25;
                if (0 < iVar25) {
                  iVar29 = 0;
                  do {
                    iVar28 = (int)B_int8_scale * (iVar29 / iVar21);
                    iVar20 = TILE_K_2 * (int)((long)iVar29 % (long)iVar21);
                    fVar17 = (float)((int)local_320 - iVar28);
                    if ((int)B_int8_scale < (int)fVar17) {
                      fVar17 = B_int8_scale;
                    }
                    iVar16 = iVar23 - iVar20;
                    if (TILE_K_2 < iVar23 - iVar20) {
                      iVar16 = TILE_K_2;
                    }
                    m_1.cstep = (size_t)local_178.w;
                    m_1.data = (void *)((long)(void **)local_178.data +
                                       ((long)iVar29 % (long)iVar21 & 0xffffffffU) * m_1.cstep *
                                       CONCAT44(local_178.elemsize._4_4_,
                                                (undefined4)local_178.elemsize) +
                                       (long)(iVar29 / iVar21) * local_178.cstep *
                                       CONCAT44(local_178.elemsize._4_4_,
                                                (undefined4)local_178.elemsize));
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)local_178.elemsize;
                    m_1.elemsize._4_4_ = local_178.elemsize._4_4_;
                    m_1.elempack = local_178.elempack;
                    m_1.allocator = local_178.allocator;
                    m_1.dims = 2;
                    m_1.w = local_178.w;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    if (iVar15 == 0) {
                      transpose_pack_B_tile_quantize
                                (B,&m_1,iVar28,(int)fVar17,iVar20,iVar16,B_int8_scale_1);
                    }
                    else {
                      pack_B_tile_quantize(B,&m_1,iVar28,(int)fVar17,iVar20,iVar16,B_int8_scale_1);
                    }
                    piVar30 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar30 != (int *)0x0) {
                      LOCK();
                      *piVar30 = *piVar30 + -1;
                      UNLOCK();
                      if (*piVar30 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    iVar29 = iVar29 + 1;
                    iVar20 = TILE_K;
                    fVar17 = B_int8_scale;
                  } while (iVar25 != iVar29);
                }
                m_1.cstep = 0;
                m_1.data = (void *)0x0;
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = 0;
                m_1.elemsize._4_4_ = 0;
                m_1.elempack = 0;
                m_1.allocator = (Allocator *)0x0;
                m_1.dims = 0;
                m_1.w = 0;
                m_1.h = 0;
                m_1.d = 0;
                m_1.c = 0;
                Mat::create(&m_1,(int)fVar17 * iVar20,1,iVar26,4,opt->workspace_allocator);
                iVar29 = -100;
                if ((m_1.data != (void *)0x0) && ((long)m_1.c * m_1.cstep != 0)) {
                  if (0 < (int)(float)local_328) {
                    local_338 = CONCAT44(local_338._4_4_,TILE_K_2);
                    iVar29 = 0;
                    uVar19 = local_320;
                    do {
                      if (iVar3 == 0) {
                        iVar26 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
                        iVar15 = pMVar5->w;
                      }
                      else {
                        iVar26 = pMVar5->w;
                        iVar15 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
                      }
                      iVar23 = iVar29 * iVar20;
                      iVar28 = iVar26 - iVar23;
                      if (iVar20 < iVar26 - iVar23) {
                        iVar28 = iVar20;
                      }
                      iVar26 = get_omp_thread_num();
                      m_2.elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                      m_2.data = (void *)((long)iVar26 * m_1.cstep * m_2.elemsize + (long)m_1.data);
                      m_2.refcount = (int *)0x0;
                      m_2.elempack = m_1.elempack;
                      m_2.allocator = m_1.allocator;
                      m_2.w = m_1.w;
                      m_2.d = 1;
                      m_2.h = m_1.h;
                      m_2.c = m_1.d;
                      m_2.dims = m_1.dims + -1;
                      m_2.cstep = (m_2.elemsize * (long)m_1.h * (long)m_1.w + 0xf &
                                  0xfffffffffffffff0) / m_2.elemsize;
                      if (m_1.dims == 4) {
                        m_2.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      if (0 < (int)uVar19) {
                        iVar26 = 0;
                        do {
                          fVar33 = (float)((int)uVar19 - iVar26);
                          if ((int)fVar17 < (int)fVar33) {
                            fVar33 = fVar17;
                          }
                          if (0 < iVar15) {
                            iVar21 = 0;
                            iVar16 = (int)local_338;
                            iVar25 = iVar15;
                            do {
                              max_kk = iVar25;
                              if (iVar16 < iVar25) {
                                max_kk = iVar16;
                              }
                              iVar14 = get_omp_thread_num();
                              local_88 = (size_t)local_1c8.w;
                              local_b8 = CONCAT44(local_1c8.elemsize._4_4_,
                                                  (undefined4)local_1c8.elemsize);
                              _TILE_M = (void *)((long)(void **)local_1c8.data +
                                                local_b8 * local_88 * (long)(iVar21 / iVar16) +
                                                (long)iVar14 * local_1c8.cstep * local_b8);
                              local_38 = (size_t)local_178.w;
                              local_68 = CONCAT44(local_178.elemsize._4_4_,
                                                  (undefined4)local_178.elemsize);
                              _TILE_N = (void *)((long)(void **)local_178.data +
                                                local_38 * local_68 * (long)(iVar21 / iVar16) +
                                                (long)(iVar26 / (int)fVar17) * local_178.cstep *
                                                local_68);
                              local_c0 = (int *)0x0;
                              local_b0 = local_1c8.elempack;
                              local_a8 = local_1c8.allocator;
                              local_a0 = 2;
                              local_9c = local_1c8.w;
                              local_98._0_4_ = 1;
                              local_98._4_4_ = 1;
                              local_90 = 1;
                              local_70 = (int *)0x0;
                              local_60 = local_178.elempack;
                              local_58 = local_178.allocator;
                              local_50 = 2;
                              local_4c = local_178.w;
                              local_48._0_4_ = 1;
                              local_48._4_4_ = 1;
                              local_40 = 1;
                              if (iVar26 == 0) {
                                if (iVar21 == 0) {
                                  if (iVar3 != 0) {
                                    transpose_compute_A_tile_int8_scales
                                              (pMVar5,(Mat *)m_3.data,B_int8_scale_1,(Mat *)m.data,
                                               iVar23,iVar28);
                                    goto LAB_004a3708;
                                  }
                                  compute_A_tile_int8_scales
                                            (pMVar5,(Mat *)m_3.data,B_int8_scale_1,(Mat *)m.data,
                                             iVar23,iVar28);
                                }
                                else if (iVar3 != 0) {
LAB_004a3708:
                                  transpose_pack_A_tile_quantize
                                            (pMVar5,(Mat *)&TILE_M,iVar23,iVar28,iVar21,max_kk,&m_3)
                                  ;
                                  goto LAB_004a3781;
                                }
                                pack_A_tile_quantize
                                          (pMVar5,(Mat *)&TILE_M,iVar23,iVar28,iVar21,max_kk,&m_3);
                              }
LAB_004a3781:
                              gemm_transB_packed_tile_int8
                                        ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar23,iVar28,iVar26,
                                         (int)fVar33,iVar21,max_kk);
                              if (local_70 != (int *)0x0) {
                                LOCK();
                                *local_70 = *local_70 + -1;
                                UNLOCK();
                                if (*local_70 == 0) {
                                  if (local_58 == (Allocator *)0x0) {
                                    if (_TILE_N != (void *)0x0) {
                                      free(_TILE_N);
                                    }
                                  }
                                  else {
                                    (*local_58->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              if (local_c0 != (int *)0x0) {
                                LOCK();
                                *local_c0 = *local_c0 + -1;
                                UNLOCK();
                                if (*local_c0 == 0) {
                                  if (local_a8 == (Allocator *)0x0) {
                                    if (_TILE_M != (void *)0x0) {
                                      free(_TILE_M);
                                    }
                                  }
                                  else {
                                    (*local_a8->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              iVar21 = iVar21 + (int)local_338;
                              iVar25 = iVar25 - (int)local_338;
                              iVar16 = (int)local_338;
                            } while (iVar21 < iVar15);
                          }
                          unpack_output_tile_int32_to_fp32
                                    ((Mat *)m_2.data,&local_268,local_d0,local_354,iVar23,iVar28,
                                     iVar26,(int)fVar33,&m,fVar1,fVar2,iVar32);
                          uVar19 = local_320;
                          iVar26 = iVar26 + (int)fVar17;
                        } while (iVar26 < (int)local_320);
                        if (m_2.refcount != (int *)0x0) {
                          LOCK();
                          *m_2.refcount = *m_2.refcount + -1;
                          UNLOCK();
                          if (*m_2.refcount == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      iVar29 = iVar29 + 1;
                    } while ((float)iVar29 != (float)local_328);
                  }
                  iVar29 = 0;
                }
                piVar30 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar30 != (int *)0x0) {
                  LOCK();
                  *piVar30 = *piVar30 + -1;
                  UNLOCK();
                  if (*piVar30 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      if (m_1.data != (void *)0x0) {
                        free(m_1.data);
                      }
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              piVar30 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar30 != (int *)0x0) {
                LOCK();
                *piVar30 = *piVar30 + -1;
                UNLOCK();
                if (*piVar30 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar30 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar30 != (int *)0x0) {
              LOCK();
              *piVar30 = *piVar30 + -1;
              UNLOCK();
              if (*piVar30 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar30 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
          if (piVar30 != (int *)0x0) {
            LOCK();
            *piVar30 = *piVar30 + -1;
            UNLOCK();
            if (*piVar30 == 0) {
              if (local_178.allocator == (Allocator *)0x0) {
                if ((Mat *)local_178.data != (Mat *)0x0) {
                  free(local_178.data);
                }
              }
              else {
                (*(local_178.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar30 == (int *)0x0) goto LAB_004a465f;
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 != 0) goto LAB_004a465f;
        if (local_1c8.allocator != (Allocator *)0x0) {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
          goto LAB_004a465f;
        }
      }
      else {
        iVar3 = (this->super_Gemm).constantN;
        iVar15 = (this->super_Gemm).constantK;
        iVar29 = (this->super_Gemm).transA;
        local_320 = CONCAT44(local_320._4_4_,iVar29);
        if (iVar29 == 0) {
          iVar28 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
        }
        else {
          iVar28 = pMVar5->w;
        }
        fVar1 = (this->super_Gemm).B_data_int8_scale;
        iVar23 = (this->super_Gemm).output_transpose;
        local_328 = CONCAT44(local_328._4_4_,(this->super_Gemm).alpha);
        fVar2 = (this->super_Gemm).beta;
        get_optimal_tile_mnk_int8
                  (iVar28,iVar3,iVar15,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_N,
                   &TILE_K,(int *)&B_int8_scale,iVar26);
        local_80 = (ulong)_TILE_N & 0xffffffff;
        iVar32 = (iVar28 + TILE_N + -1) / TILE_N;
        local_1c8.cstep = 0;
        local_1c8.data = (Mat *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        Mat::create(&local_1c8,iVar28,4,opt->workspace_allocator);
        iVar29 = -100;
        if (((Mat *)local_1c8.data != (Mat *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
          local_178.cstep = 0;
          local_178.data = (Mat *)0x0;
          local_178.refcount._0_4_ = 0;
          local_178.refcount._4_4_ = 0;
          local_178.elemsize._0_4_ = 0;
          local_178.elemsize._4_4_ = 0;
          local_178.elempack = 0;
          local_178.allocator = (Allocator *)0x0;
          local_178.dims = 0;
          local_178.w = 0;
          local_178.h = 0;
          local_178.d = 0;
          local_178.c = 0;
          Mat::create(&local_178,iVar28,4,opt->workspace_allocator);
          iVar29 = -100;
          if (((Mat *)local_178.data != (Mat *)0x0) && ((long)local_178.c * local_178.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            iVar28 = (int)local_80;
            if ((int)B_int8_scale < 4) {
LAB_004a3a5d:
              Mat::create(&m_3,(int)B_int8_scale * iVar28,
                          (iVar15 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar26,1,
                          opt->workspace_allocator);
            }
            else {
              iVar29 = cpu_support_x86_avx512_vnni();
              bVar35 = true;
              if (iVar29 == 0) {
                iVar29 = cpu_support_x86_avx_vnni();
                bVar35 = iVar29 != 0;
              }
              iVar29 = cpu_support_x86_avx_vnni_int8();
              if (!(bool)(bVar35 & iVar29 == 0)) goto LAB_004a3a5d;
              iVar29 = 0x40;
              if (((iVar28 < 0x10) && (iVar29 = 0x20, iVar28 < 8)) && (iVar29 = 0x10, iVar28 < 4)) {
                iVar29 = (uint)(1 < iVar28) * 4 + 4;
              }
              Mat::create(&m_3,(iVar29 + (int)B_int8_scale) * iVar28,
                          (iVar15 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar26,1,
                          opt->workspace_allocator);
            }
            iVar29 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              local_338 = CONCAT44(local_338._4_4_,TILE_K);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,TILE_K * iVar28,1,iVar26,4,opt->workspace_allocator);
              iVar29 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                if (0 < iVar32) {
                  iVar26 = 0;
                  iVar29 = (int)local_338;
                  do {
                    if ((int)local_320 == 0) {
                      iVar15 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
                      fVar17 = (float)pMVar5->w;
                    }
                    else {
                      iVar15 = pMVar5->w;
                      fVar17 = (float)(pMVar5->elempack *
                                      (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2]);
                    }
                    iVar16 = (int)local_80;
                    iVar20 = iVar26 * iVar16;
                    iVar28 = iVar15 - iVar20;
                    if (iVar16 < iVar15 - iVar20) {
                      iVar28 = iVar16;
                    }
                    iVar15 = get_omp_thread_num();
                    uVar19 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                    m_1.data = (void *)((long)iVar15 * m.cstep * uVar19 + (long)m.data);
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                    m_1.elemsize._4_4_ = m.elemsize._4_4_;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.w = m.w;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = m.d;
                    m_1.dims = m.dims + -1;
                    m_1.cstep = (uVar19 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar19
                    ;
                    if (m.dims == 4) {
                      m_1.cstep = (long)m.h * (long)m.w;
                    }
                    if (0 < iVar3) {
                      iVar15 = 0;
                      do {
                        iVar16 = iVar3 - iVar15;
                        if (iVar29 < iVar3 - iVar15) {
                          iVar16 = iVar29;
                        }
                        if (0 < (int)fVar17) {
                          iVar29 = 0;
                          fVar33 = fVar17;
                          do {
                            max_kk_00 = fVar33;
                            if ((int)B_int8_scale < (int)fVar33) {
                              max_kk_00 = B_int8_scale;
                            }
                            iVar25 = get_omp_thread_num();
                            m_2.cstep = (size_t)m_3.w;
                            m_2.elemsize = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                            m_2.data = (void *)((long)m_3.data +
                                               m_2.elemsize * m_2.cstep *
                                               (long)(iVar29 / (int)B_int8_scale) +
                                               (long)iVar25 * m_3.cstep * m_2.elemsize);
                            m_2.refcount = (int *)0x0;
                            m_2.elempack = m_3.elempack;
                            m_2.allocator = m_3.allocator;
                            m_2.dims = 2;
                            m_2.w = m_3.w;
                            m_2.h = 1;
                            m_2.d = 1;
                            m_2.c = 1;
                            local_9c = (this->BT_data).w;
                            local_88 = (size_t)local_9c;
                            local_b8 = (this->BT_data).elemsize;
                            _TILE_M = (void *)((long)(this->BT_data).data +
                                              local_88 * local_b8 *
                                              (long)(iVar29 / (int)B_int8_scale) +
                                              (long)(iVar15 / (int)local_338) *
                                              (this->BT_data).cstep * local_b8);
                            local_b0 = (this->BT_data).elempack;
                            local_a8 = (this->BT_data).allocator;
                            local_c0 = (int *)0x0;
                            local_a0 = 2;
                            local_98._0_4_ = 1;
                            local_98._4_4_ = 1;
                            local_90 = 1;
                            if (iVar15 == 0) {
                              if (iVar29 == 0) {
                                if ((int)local_320 != 0) {
                                  transpose_compute_A_tile_int8_scales
                                            (pMVar5,(Mat *)local_1c8.data,fVar1,
                                             (Mat *)local_178.data,iVar20,iVar28);
                                  goto LAB_004a3e8a;
                                }
                                compute_A_tile_int8_scales
                                          (pMVar5,(Mat *)local_1c8.data,fVar1,(Mat *)local_178.data,
                                           iVar20,iVar28);
                              }
                              else if ((int)local_320 != 0) {
LAB_004a3e8a:
                                transpose_pack_A_tile_quantize
                                          (pMVar5,&m_2,iVar20,iVar28,iVar29,(int)max_kk_00,
                                           &local_1c8);
                                goto LAB_004a3f07;
                              }
                              pack_A_tile_quantize
                                        (pMVar5,&m_2,iVar20,iVar28,iVar29,(int)max_kk_00,&local_1c8)
                              ;
                            }
LAB_004a3f07:
                            gemm_transB_packed_tile_int8
                                      (&m_2,(Mat *)&TILE_M,&m_1,iVar20,iVar28,iVar15,iVar16,iVar29,
                                       (int)max_kk_00);
                            if (local_c0 != (int *)0x0) {
                              LOCK();
                              *local_c0 = *local_c0 + -1;
                              UNLOCK();
                              if (*local_c0 == 0) {
                                if (local_a8 == (Allocator *)0x0) {
                                  if (_TILE_M != (void *)0x0) {
                                    free(_TILE_M);
                                  }
                                }
                                else {
                                  (*local_a8->_vptr_Allocator[3])();
                                }
                              }
                            }
                            if (m_2.refcount != (int *)0x0) {
                              LOCK();
                              *m_2.refcount = *m_2.refcount + -1;
                              UNLOCK();
                              if (*m_2.refcount == 0) {
                                if (m_2.allocator == (Allocator *)0x0) {
                                  if (m_2.data != (void *)0x0) {
                                    free(m_2.data);
                                  }
                                }
                                else {
                                  (*(m_2.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                            iVar29 = iVar29 + (int)B_int8_scale;
                            fVar33 = (float)((int)fVar33 - (int)B_int8_scale);
                          } while (iVar29 < (int)fVar17);
                        }
                        unpack_output_tile_int32_to_fp32
                                  ((Mat *)m_1.data,&local_268,local_d0,local_354,iVar20,iVar28,
                                   iVar15,iVar16,&local_178,(float)local_328,fVar2,iVar23);
                        iVar29 = (int)local_338;
                        iVar15 = iVar15 + (int)local_338;
                      } while (iVar15 < iVar3);
                      piVar30 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar30 != (int *)0x0) {
                        LOCK();
                        *piVar30 = *piVar30 + -1;
                        UNLOCK();
                        if (*piVar30 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    iVar26 = iVar26 + 1;
                  } while (iVar26 != iVar32);
                }
                iVar29 = 0;
              }
              piVar30 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar30 != (int *)0x0) {
                LOCK();
                *piVar30 = *piVar30 + -1;
                UNLOCK();
                if (*piVar30 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar30 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar30 != (int *)0x0) {
              LOCK();
              *piVar30 = *piVar30 + -1;
              UNLOCK();
              if (*piVar30 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar30 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
          if (piVar30 != (int *)0x0) {
            LOCK();
            *piVar30 = *piVar30 + -1;
            UNLOCK();
            if (*piVar30 == 0) {
              if (local_178.allocator == (Allocator *)0x0) {
                if ((Mat *)local_178.data != (Mat *)0x0) {
                  free(local_178.data);
                }
              }
              else {
                (*(local_178.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar30 == (int *)0x0) goto LAB_004a465f;
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 != 0) goto LAB_004a465f;
        if (local_1c8.allocator != (Allocator *)0x0) {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
          goto LAB_004a465f;
        }
      }
    }
    else {
      uVar13 = (this->super_Gemm).constantM;
      uVar19 = (ulong)uVar13;
      iVar3 = (this->super_Gemm).constantK;
      iVar15 = (this->super_Gemm).transB;
      if (iVar15 == 0) {
        iVar28 = pMVar5->w;
      }
      else {
        iVar28 = pMVar5->elempack * (&pMVar5->h)[(ulong)(pMVar5->dims == 3) * 2];
      }
      local_320 = (ulong)(uint)(this->super_Gemm).output_transpose;
      fVar1 = (this->super_Gemm).alpha;
      fVar2 = (this->super_Gemm).beta;
      get_optimal_tile_mnk_int8
                (uVar13,iVar28,iVar3,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar26);
      pvVar6 = _TILE_M;
      uVar13 = (int)(TILE_M + uVar13 + -1) / TILE_M;
      local_338 = (ulong)_TILE_N & 0xffffffff;
      iVar32 = (iVar28 + TILE_N + -1) / TILE_N;
      iVar23 = (TILE_K + iVar3 + -1) / TILE_K;
      local_1c8.cstep = 0;
      local_1c8.data = (Mat *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K * TILE_N,iVar23,iVar32,1,opt->workspace_allocator);
      iVar29 = -100;
      local_328 = uVar19;
      if (((Mat *)local_1c8.data != (Mat *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
        compute_B_int8_scale(pMVar5,&B_int8_scale);
        local_178.cstep = 0;
        local_178.data = (Mat *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        Mat::create(&local_178,(int)local_328,4,opt->workspace_allocator);
        iVar29 = -100;
        if (((Mat *)local_178.data != (Mat *)0x0) && ((long)local_178.c * local_178.cstep != 0)) {
          iVar32 = iVar32 * iVar23;
          if (0 < (int)local_328) {
            pvVar7 = (this->super_Gemm).A_data_int8_scales.data;
            uVar19 = 0;
            do {
              *(float *)((long)(void **)local_178.data + uVar19 * 4) =
                   1.0 / (B_int8_scale * *(float *)((long)pvVar7 + uVar19 * 4));
              uVar19 = uVar19 + 1;
            } while (local_328 != uVar19);
          }
          if (0 < iVar32) {
            iVar29 = 0;
            do {
              iVar16 = TILE_N * (iVar29 / iVar23);
              iVar25 = TILE_K * (int)((long)iVar29 % (long)iVar23);
              iVar20 = iVar28 - iVar16;
              if (TILE_N < iVar28 - iVar16) {
                iVar20 = TILE_N;
              }
              iVar21 = iVar3 - iVar25;
              if (TILE_K < iVar3 - iVar25) {
                iVar21 = TILE_K;
              }
              m_3.cstep = (size_t)local_1c8.w;
              m_3.data = (void *)((long)(void **)local_1c8.data +
                                 ((long)iVar29 % (long)iVar23 & 0xffffffffU) * m_3.cstep *
                                 CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) +
                                 (long)(iVar29 / iVar23) * local_1c8.cstep *
                                 CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
              m_3.refcount._0_4_ = 0;
              m_3.refcount._4_4_ = 0;
              m_3.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
              m_3.elemsize._4_4_ = local_1c8.elemsize._4_4_;
              m_3.elempack = local_1c8.elempack;
              m_3.allocator = local_1c8.allocator;
              m_3.dims = 2;
              m_3.w = local_1c8.w;
              m_3.h = 1;
              m_3.d = 1;
              m_3.c = 1;
              if (iVar15 == 0) {
                transpose_pack_B_tile_quantize(pMVar5,&m_3,iVar16,iVar20,iVar25,iVar21,B_int8_scale)
                ;
              }
              else {
                pack_B_tile_quantize(pMVar5,&m_3,iVar16,iVar20,iVar25,iVar21,B_int8_scale);
              }
              piVar30 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
              if (piVar30 != (int *)0x0) {
                LOCK();
                *piVar30 = *piVar30 + -1;
                UNLOCK();
                if (*piVar30 == 0) {
                  if (m_3.allocator == (Allocator *)0x0) {
                    if (m_3.data != (void *)0x0) {
                      free(m_3.data);
                    }
                  }
                  else {
                    (*(m_3.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar29 = iVar29 + 1;
            } while (iVar32 != iVar29);
            local_338 = (ulong)_TILE_N & 0xffffffff;
            pvVar6 = _TILE_M;
          }
          iVar15 = (int)pvVar6;
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,(int)local_338 * iVar15,1,iVar26,4,opt->workspace_allocator);
          iVar29 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            if (0 < (int)uVar13) {
              uVar31 = 0;
              uVar18 = local_328;
              uVar19 = local_338;
              do {
                iVar26 = iVar15 * (int)uVar31;
                iVar29 = (int)uVar18 - iVar26;
                if (iVar15 < iVar29) {
                  iVar29 = iVar15;
                }
                iVar23 = get_omp_thread_num();
                uVar12 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                m.data = (void *)((long)iVar23 * m_3.cstep * uVar12 + (long)m_3.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)m_3.elemsize;
                m.elemsize._4_4_ = m_3.elemsize._4_4_;
                m.elempack = m_3.elempack;
                m.allocator = m_3.allocator;
                m.w = m_3.w;
                m.h = m_3.h;
                m.d = 1;
                m.c = m_3.d;
                m.dims = m_3.dims + -1;
                m.cstep = (uVar12 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar12;
                if (m_3.dims == 4) {
                  m.cstep = (long)m_3.h * (long)m_3.w;
                }
                if (0 < iVar28) {
                  iVar23 = 0;
                  do {
                    iVar32 = iVar28 - iVar23;
                    if ((int)uVar19 < iVar28 - iVar23) {
                      iVar32 = (int)uVar19;
                    }
                    if (0 < iVar3) {
                      iVar16 = iVar23 / (int)local_338;
                      iVar25 = 0;
                      iVar20 = iVar3;
                      do {
                        iVar21 = iVar20;
                        if (TILE_K < iVar20) {
                          iVar21 = TILE_K;
                        }
                        m_1.w = (this->AT_data).w;
                        m_1.cstep = (size_t)m_1.w;
                        sVar34 = (this->AT_data).elemsize;
                        m_1.elempack = (this->AT_data).elempack;
                        m_1.allocator = (this->AT_data).allocator;
                        m_1.data = (void *)((long)(this->AT_data).data +
                                           sVar34 * m_1.cstep * (long)(iVar25 / TILE_K) +
                                           (this->AT_data).cstep * uVar31 * sVar34);
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = (undefined4)sVar34;
                        m_1.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
                        m_1.dims = 2;
                        m_1.h = 1;
                        m_1.d = 1;
                        m_1.c = 1;
                        m_2.cstep = (size_t)local_1c8.w;
                        m_2.elemsize = CONCAT44(local_1c8.elemsize._4_4_,
                                                (undefined4)local_1c8.elemsize);
                        m_2.data = (void *)((long)(void **)local_1c8.data +
                                           m_2.cstep * m_2.elemsize * (long)(iVar25 / TILE_K) +
                                           local_1c8.cstep * (long)iVar16 * m_2.elemsize);
                        m_2.refcount = (int *)0x0;
                        m_2.elempack = local_1c8.elempack;
                        m_2.allocator = local_1c8.allocator;
                        m_2.dims = 2;
                        m_2.w = local_1c8.w;
                        m_2.h = 1;
                        m_2.d = 1;
                        m_2.c = 1;
                        gemm_transB_packed_tile_int8
                                  (&m_1,&m_2,&m,iVar26,iVar29,iVar23,iVar32,iVar25,iVar21);
                        if (m_2.refcount != (int *)0x0) {
                          LOCK();
                          *m_2.refcount = *m_2.refcount + -1;
                          UNLOCK();
                          if (*m_2.refcount == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        piVar30 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                        if (piVar30 != (int *)0x0) {
                          LOCK();
                          *piVar30 = *piVar30 + -1;
                          UNLOCK();
                          if (*piVar30 == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              if (m_1.data != (void *)0x0) {
                                free(m_1.data);
                              }
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        iVar25 = iVar25 + TILE_K;
                        iVar20 = iVar20 - TILE_K;
                      } while (iVar25 < iVar3);
                    }
                    unpack_output_tile_int32_to_fp32
                              ((Mat *)m.data,&local_268,local_d0,local_354,iVar26,iVar29,iVar23,
                               iVar32,&local_178,fVar1,fVar2,(int)local_320);
                    uVar18 = local_328;
                    uVar19 = local_338;
                    iVar23 = iVar23 + (int)local_338;
                  } while (iVar23 < iVar28);
                  piVar30 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar30 != (int *)0x0) {
                    LOCK();
                    *piVar30 = *piVar30 + -1;
                    UNLOCK();
                    if (*piVar30 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar13);
            }
            iVar29 = 0;
          }
          piVar30 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar30 != (int *)0x0) {
            LOCK();
            *piVar30 = *piVar30 + -1;
            UNLOCK();
            if (*piVar30 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar30 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar30 != (int *)0x0) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if ((Mat *)local_178.data != (Mat *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar30 == (int *)0x0) goto LAB_004a465f;
      LOCK();
      *piVar30 = *piVar30 + -1;
      UNLOCK();
      if (*piVar30 != 0) goto LAB_004a465f;
      if (local_1c8.allocator != (Allocator *)0x0) {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
        goto LAB_004a465f;
      }
    }
  }
  else {
    fVar1 = (this->super_Gemm).B_data_int8_scale;
    uVar13 = (this->super_Gemm).constantM;
    iVar29 = (this->super_Gemm).constantN;
    iVar3 = (this->super_Gemm).constantK;
    iVar15 = (this->super_Gemm).output_transpose;
    fVar2 = (this->super_Gemm).alpha;
    fVar17 = (this->super_Gemm).beta;
    local_320 = CONCAT44(local_320._4_4_,iVar29);
    get_optimal_tile_mnk_int8
              (uVar13,iVar29,iVar3,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,(int *)&m_2,
               &TILE_M,&TILE_N,iVar26);
    local_328 = (ulong)m_2.data & 0xffffffff;
    uVar19 = (long)(int)((int)m_2.data + uVar13 + -1) / (long)(int)m_2.data;
    local_1c8.cstep = 0;
    local_1c8.data = (Mat *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    Mat::create(&local_1c8,uVar13,4,opt->workspace_allocator);
    iVar29 = -100;
    if (((Mat *)local_1c8.data != (Mat *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
      if (0 < (int)uVar13) {
        pvVar6 = (this->super_Gemm).A_data_int8_scales.data;
        uVar18 = 0;
        do {
          *(float *)((long)(void **)local_1c8.data + uVar18 * 4) =
               1.0 / (fVar1 * *(float *)((long)pvVar6 + uVar18 * 4));
          uVar18 = uVar18 + 1;
        } while (uVar13 != uVar18);
      }
      iVar28 = TILE_M;
      local_178.cstep = 0;
      local_178.data = (Mat *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.allocator = (Allocator *)0x0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      Mat::create(&local_178,TILE_M * (int)(float)local_328,1,iVar26,4,opt->workspace_allocator);
      iVar29 = -100;
      if (((Mat *)local_178.data != (Mat *)0x0) && ((long)local_178.c * local_178.cstep != 0)) {
        if (0 < (int)uVar19) {
          iVar26 = TILE_N;
          uVar18 = 0;
          iVar29 = (int)local_320;
          do {
            iVar32 = (int)local_328;
            iVar20 = iVar32 * (int)uVar18;
            iVar23 = uVar13 - iVar20;
            if (iVar32 < (int)(uVar13 - iVar20)) {
              iVar23 = iVar32;
            }
            iVar32 = get_omp_thread_num();
            uVar31 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
            m_3.data = (void *)((long)(void **)local_178.data +
                               (long)iVar32 * local_178.cstep * uVar31);
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_178.elemsize;
            m_3.elemsize._4_4_ = local_178.elemsize._4_4_;
            m_3.elempack = local_178.elempack;
            m_3.allocator = local_178.allocator;
            m_3.w = local_178.w;
            m_3.h = local_178.h;
            m_3.d = 1;
            m_3.c = local_178.d;
            m_3.dims = local_178.dims + -1;
            m_3.cstep = (uVar31 * (long)local_178.h * (long)local_178.w + 0xf & 0xfffffffffffffff0)
                        / uVar31;
            if (local_178.dims == 4) {
              m_3.cstep = (long)local_178.h * (long)local_178.w;
            }
            if (0 < iVar29) {
              iVar32 = 0;
              do {
                iVar16 = iVar29 - iVar32;
                if (iVar28 < iVar29 - iVar32) {
                  iVar16 = iVar28;
                }
                if (0 < iVar3) {
                  local_338 = (ulong)(iVar32 / iVar28);
                  iVar25 = 0;
                  iVar29 = iVar3;
                  do {
                    iVar21 = iVar29;
                    if (iVar26 < iVar29) {
                      iVar21 = iVar26;
                    }
                    m.w = (this->AT_data).w;
                    m.cstep = (size_t)m.w;
                    sVar34 = (this->AT_data).elemsize;
                    m.elempack = (this->AT_data).elempack;
                    m.allocator = (this->AT_data).allocator;
                    m.data = (void *)((long)(this->AT_data).data +
                                     sVar34 * m.cstep * (long)(iVar25 / iVar26) +
                                     (this->AT_data).cstep * uVar18 * sVar34);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar34;
                    m.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
                    m.dims = 2;
                    m.h = 1;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = (this->BT_data).w;
                    m_1.cstep = (size_t)m_1.w;
                    sVar34 = (this->BT_data).elemsize;
                    m_1.elempack = (this->BT_data).elempack;
                    m_1.data = (void *)((long)(this->BT_data).data +
                                       m_1.cstep * sVar34 * (long)(iVar25 / iVar26) +
                                       (this->BT_data).cstep * local_338 * sVar34);
                    m_1.allocator = (this->BT_data).allocator;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)sVar34;
                    m_1.elemsize._4_4_ = (undefined4)(sVar34 >> 0x20);
                    m_1.dims = 2;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    gemm_transB_packed_tile_int8
                              (&m,&m_1,&m_3,iVar20,iVar23,iVar32,iVar16,iVar25,iVar21);
                    piVar30 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar30 != (int *)0x0) {
                      LOCK();
                      *piVar30 = *piVar30 + -1;
                      UNLOCK();
                      if (*piVar30 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    piVar30 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar30 != (int *)0x0) {
                      LOCK();
                      *piVar30 = *piVar30 + -1;
                      UNLOCK();
                      if (*piVar30 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    iVar25 = iVar25 + iVar26;
                    iVar29 = iVar29 - iVar26;
                  } while (iVar25 < iVar3);
                }
                unpack_output_tile_int32_to_fp32
                          ((Mat *)m_3.data,&local_268,local_d0,local_354,iVar20,iVar23,iVar32,iVar16
                           ,&local_1c8,fVar2,fVar17,iVar15);
                iVar32 = iVar32 + iVar28;
                iVar29 = (int)local_320;
              } while (iVar32 < (int)local_320);
              piVar30 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
              if (piVar30 != (int *)0x0) {
                LOCK();
                *piVar30 = *piVar30 + -1;
                UNLOCK();
                if (*piVar30 == 0) {
                  if (m_3.allocator == (Allocator *)0x0) {
                    if (m_3.data != (void *)0x0) {
                      free(m_3.data);
                    }
                  }
                  else {
                    (*(m_3.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != (uVar19 & 0xffffffff));
        }
        iVar29 = 0;
      }
      piVar30 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if ((Mat *)local_178.data != (Mat *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar30 == (int *)0x0) goto LAB_004a465f;
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 != 0) goto LAB_004a465f;
    if (local_1c8.allocator != (Allocator *)0x0) {
      (*(local_1c8.allocator)->_vptr_Allocator[3])();
      goto LAB_004a465f;
    }
  }
  if ((Mat *)local_1c8.data != (Mat *)0x0) {
    free(local_1c8.data);
  }
LAB_004a465f:
  piVar30 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_268.allocator == (Allocator *)0x0) {
        if (local_268.data != (void *)0x0) {
          free(local_268.data);
        }
      }
      else {
        (*(local_268.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar29;
}

Assistant:

int Gemm_x86_avx512::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}